

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulcalc.cpp
# Opt level: O0

void split_tiv_classic(vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_> *gulitems,
                      OASIS_FLOAT tiv)

{
  double dVar1;
  bool bVar2;
  pointer pgVar3;
  double dVar4;
  double dVar5;
  double percentage;
  gulItemIDLoss *local_38;
  gulItemIDLoss *local_30;
  __normal_iterator<gulItemIDLoss_*,_std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>
  local_28;
  __normal_iterator<gulItemIDLoss_*,_std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>
  local_20;
  iterator iter;
  OASIS_FLOAT total_loss;
  OASIS_FLOAT tiv_local;
  vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_> *gulitems_local;
  
  if (0.0 < tiv) {
    iter._M_current._0_4_ = 0.0;
    iter._M_current._4_4_ = tiv;
    local_20._M_current =
         (gulItemIDLoss *)
         std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>::begin(gulitems);
    while( true ) {
      local_28._M_current =
           (gulItemIDLoss *)
           std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>::end(gulitems);
      bVar2 = __gnu_cxx::operator!=(&local_20,&local_28);
      if (!bVar2) break;
      pgVar3 = __gnu_cxx::
               __normal_iterator<gulItemIDLoss_*,_std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>
               ::operator->(&local_20);
      iter._M_current._0_4_ = (float)((double)iter._M_current._0_4_ + pgVar3->loss);
      local_30 = (gulItemIDLoss *)
                 __gnu_cxx::
                 __normal_iterator<gulItemIDLoss_*,_std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>
                 ::operator++(&local_20,0);
    }
    if (iter._M_current._4_4_ < iter._M_current._0_4_) {
      local_38 = (gulItemIDLoss *)
                 std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>::begin(gulitems);
      local_20._M_current = local_38;
      while( true ) {
        percentage = (double)std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>::end
                                       (gulitems);
        bVar2 = __gnu_cxx::operator!=
                          (&local_20,
                           (__normal_iterator<gulItemIDLoss_*,_std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>
                            *)&percentage);
        if (!bVar2) break;
        pgVar3 = __gnu_cxx::
                 __normal_iterator<gulItemIDLoss_*,_std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>
                 ::operator->(&local_20);
        dVar1 = pgVar3->loss;
        dVar4 = (double)iter._M_current._0_4_;
        dVar5 = (double)iter._M_current._4_4_;
        pgVar3 = __gnu_cxx::
                 __normal_iterator<gulItemIDLoss_*,_std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>
                 ::operator->(&local_20);
        pgVar3->loss = (dVar1 / dVar4) * dVar5;
        __gnu_cxx::
        __normal_iterator<gulItemIDLoss_*,_std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>
        ::operator++(&local_20,0);
      }
    }
  }
  return;
}

Assistant:

void split_tiv_classic(std::vector<gulItemIDLoss> &gulitems, OASIS_FLOAT tiv)
{
// if the total loss exceeds the tiv 
// then split tiv in the same proportions to the losses
	if (tiv > 0) {
		OASIS_FLOAT total_loss = 0;
		auto iter = gulitems.begin();
		while (iter != gulitems.end()) {
			total_loss += iter->loss;
			iter++;
		}
		if (total_loss > tiv) {
			iter = gulitems.begin();
			while (iter != gulitems.end()) {
				double percentage = iter->loss / total_loss;
				iter->loss = percentage * tiv;
				iter++;
			}
		}
	}
}